

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

void apprun_concat_path(char *dest,char *path)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  
  sVar1 = strlen(path);
  if (sVar1 != 0) {
    sVar2 = strlen(dest);
    if (sVar2 == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = sVar2 - (dest[sVar2 - 1] == '/');
    }
    if (dest[lVar3] == '\0') {
      dest[lVar3] = '/';
    }
    lVar4 = 0;
    do {
      if ((dest[lVar3] != '/') || (path[lVar4] != '/')) {
        lVar3 = lVar3 + 1;
      }
      dest[lVar3] = path[lVar4];
      lVar4 = lVar4 + 1;
    } while (sVar1 + 1 != lVar4);
  }
  return;
}

Assistant:

void apprun_concat_path(char *dest, const char *path) {
    unsigned long path_len = strlen(path);
    if (path_len == 0)
        return;

    unsigned long dest_len = strlen(dest);
    unsigned long j = dest_len;

    if (j > 0 && dest[j - 1] == '/')
        j--;

    if (dest[j] == '\0')
        dest[j] = '/';

    // copy str avoiding repeated slashes
    for (int i = 0; i <= path_len; i++) {
        if (!(dest[j] == '/' && path[i] == '/'))
            j++;

        dest[j] = path[i];
    }
}